

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_engines.cc
# Opt level: O2

void advance_engine<trng::lagfib4xor<unsigned_int,168u,205u,242u,521u>>
               (lagfib4xor<unsigned_int,_168U,_205U,_242U,_521U> *r1,long N)

{
  long lVar1;
  bool bVar2;
  
  lVar1 = 0;
  if (0 < N) {
    lVar1 = N;
  }
  while (bVar2 = lVar1 != 0, lVar1 = lVar1 + -1, bVar2) {
    trng::lagfib4xor<unsigned_int,_168U,_205U,_242U,_521U>::operator()(r1);
  }
  return;
}

Assistant:

void advance_engine(R &r1, const long N) {
  for (long i{0}; i < N; ++i)
    r1();
}